

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateArgInfo
          (ValidationState_t *_,Instruction *inst,uint32_t info_index)

{
  bool bVar1;
  uint uVar2;
  Op opcode;
  uint uVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_5c0;
  NonSemanticClspvReflectionInstructions local_3e4;
  undefined1 local_3e0 [4];
  NonSemanticClspvReflectionInstructions ext_inst;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *info;
  Instruction *pIStack_20;
  uint32_t info_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  info._4_4_ = info_index;
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  uVar2 = val::Instruction::GetOperandAs<unsigned_int>(inst,(ulong)info_index);
  local_30 = ValidationState_t::FindDef(_,uVar2);
  if (local_30 != (Instruction *)0x0) {
    opcode = val::Instruction::opcode(local_30);
    bVar1 = spvIsExtendedInstruction(opcode);
    if (bVar1) {
      uVar2 = val::Instruction::GetOperandAs<unsigned_int>(local_30,2);
      uVar3 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,2);
      if (uVar2 != uVar3) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_3e0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_3e0,
                            (char (*) [58])
                            "ArgInfo must be from the same extended instruction import");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e0);
        return __local._4_4_;
      }
      local_3e4 = val::Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(local_30,3)
      ;
      if (local_3e4 != NonSemanticClspvReflectionArgumentInfo) {
        ValidationState_t::diag
                  (&local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_5c0,
                            (char (*) [53])"ArgInfo must be an ArgumentInfo extended instruction");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_5c0);
        return __local._4_4_;
      }
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  pDVar4 = DiagnosticStream::operator<<
                     (&local_208,
                      (char (*) [53])"ArgInfo must be an ArgumentInfo extended instruction");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateArgInfo(ValidationState_t& _, const Instruction* inst,
                             uint32_t info_index) {
  auto info = _.FindDef(inst->GetOperandAs<uint32_t>(info_index));
  if (!info || !spvIsExtendedInstruction(info->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "ArgInfo must be an ArgumentInfo extended instruction";
  }

  if (info->GetOperandAs<uint32_t>(2) != inst->GetOperandAs<uint32_t>(2)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "ArgInfo must be from the same extended instruction import";
  }

  auto ext_inst = info->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  if (ext_inst != NonSemanticClspvReflectionArgumentInfo) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "ArgInfo must be an ArgumentInfo extended instruction";
  }

  return SPV_SUCCESS;
}